

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O2

void __thiscall GuillotineBinPack::Init(GuillotineBinPack *this,int width,int height)

{
  Rect n;
  Rect local_30;
  
  this->binWidth = width;
  this->binHeight = height;
  TArray<Rect,_Rect>::Clear(&(this->disjointRects).rects);
  TArray<Rect,_Rect>::Clear(&this->usedRectangles);
  local_30.x = 0;
  local_30.y = 0;
  local_30.width = width;
  local_30.height = height;
  TArray<Rect,_Rect>::Clear(&this->freeRectangles);
  TArray<Rect,_Rect>::Push(&this->freeRectangles,&local_30);
  return;
}

Assistant:

void GuillotineBinPack::Init(int width, int height)
{
	binWidth = width;
	binHeight = height;

#ifdef _DEBUG
	disjointRects.Clear();
#endif

	// Clear any memory of previously packed rectangles.
	usedRectangles.Clear();

	// We start with a single big free rectangle that spans the whole bin.
	Rect n;
	n.x = 0;
	n.y = 0;
	n.width = width;
	n.height = height;

	freeRectangles.Clear();
	freeRectangles.Push(n);
}